

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::sub_val(CVmObjBigNum *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *val)

{
  int iVar1;
  vm_val_t *this_00;
  undefined8 *in_RCX;
  vm_obj_id_t in_EDX;
  CVmObjBigNum *in_RDI;
  vm_val_t val2;
  vm_val_t *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  char *ext2;
  vm_val_t *result_00;
  
  result_00 = (vm_val_t *)*in_RCX;
  iVar1 = cvt_to_bignum(in_RDI,(vm_obj_id_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    err_throw(0);
  }
  this_00 = CVmStack::push();
  vm_val_t::set_obj(this_00,in_EDX);
  CVmStack::push((vm_val_t *)&stack0xffffffffffffffd0);
  ext2 = (in_RDI->super_CVmObject).ext_;
  get_objid_ext(0);
  compute_diff(result_00,(char *)in_RDI,ext2);
  CVmStack::discard(2);
  return 1;
}

Assistant:

int CVmObjBigNum::sub_val(VMG_ vm_val_t *result,
                          vm_obj_id_t self, const vm_val_t *val)
{
    vm_val_t val2;

    /* convert it */
    val2 = *val;
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* this type is not convertible to BigNumber, so we can't use it */
        err_throw(VMERR_BAD_TYPE_SUB);
    }

    /* push 'self' and the other value to protect against GC */
    G_stk->push()->set_obj(self);
    G_stk->push(&val2);

    /* compute the difference */
    compute_diff(vmg_ result, ext_, get_objid_ext(vmg_ val2.val.obj));

    /* discard the GC protection items */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}